

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O1

void __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::SLUFactor(SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this)

{
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  int iVar2;
  cpp_dec_float<100U,_int,_void> *pcVar3;
  Timer *pTVar4;
  shared_ptr<soplex::Tolerances> local_68;
  shared_ptr<soplex::Tolerances> local_58;
  shared_ptr<soplex::Tolerances> local_48;
  
  (this->
  super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  )._vptr_SLinSolver = (_func_int **)&PTR___cxa_pure_virtual_006b0d08;
  (this->
  super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).spxout = (SPxOut *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).initMaxabs.m_backend.fpclass = cpp_dec_float_finite;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).initMaxabs.m_backend.prec_elem = 0x10;
  pnVar1 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).initMaxabs;
  (pnVar1->m_backend).data._M_elems[0] = 0;
  (pnVar1->m_backend).data._M_elems[1] = 0;
  pcVar3 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).initMaxabs.m_backend;
  (pcVar3->data)._M_elems[2] = 0;
  (pcVar3->data)._M_elems[3] = 0;
  pcVar3 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).initMaxabs.m_backend;
  (pcVar3->data)._M_elems[4] = 0;
  (pcVar3->data)._M_elems[5] = 0;
  pcVar3 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).initMaxabs.m_backend;
  (pcVar3->data)._M_elems[6] = 0;
  (pcVar3->data)._M_elems[7] = 0;
  pcVar3 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).initMaxabs.m_backend;
  (pcVar3->data)._M_elems[8] = 0;
  (pcVar3->data)._M_elems[9] = 0;
  pcVar3 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).initMaxabs.m_backend;
  (pcVar3->data)._M_elems[10] = 0;
  (pcVar3->data)._M_elems[0xb] = 0;
  pcVar3 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).initMaxabs.m_backend;
  (pcVar3->data)._M_elems[0xc] = 0;
  (pcVar3->data)._M_elems[0xd] = 0;
  pcVar3 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).initMaxabs.m_backend;
  (pcVar3->data)._M_elems[0xe] = 0;
  (pcVar3->data)._M_elems[0xf] = 0;
  *(undefined8 *)
   ((long)(this->
          super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).initMaxabs.m_backend.data._M_elems + 0x3d) = 0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).maxabs.m_backend.fpclass = cpp_dec_float_finite;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).maxabs.m_backend.prec_elem = 0x10;
  pnVar1 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).maxabs;
  (pnVar1->m_backend).data._M_elems[0] = 0;
  (pnVar1->m_backend).data._M_elems[1] = 0;
  pcVar3 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).maxabs.m_backend;
  (pcVar3->data)._M_elems[2] = 0;
  (pcVar3->data)._M_elems[3] = 0;
  pcVar3 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).maxabs.m_backend;
  (pcVar3->data)._M_elems[4] = 0;
  (pcVar3->data)._M_elems[5] = 0;
  pcVar3 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).maxabs.m_backend;
  (pcVar3->data)._M_elems[6] = 0;
  (pcVar3->data)._M_elems[7] = 0;
  pcVar3 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).maxabs.m_backend;
  (pcVar3->data)._M_elems[8] = 0;
  (pcVar3->data)._M_elems[9] = 0;
  pcVar3 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).maxabs.m_backend;
  (pcVar3->data)._M_elems[10] = 0;
  (pcVar3->data)._M_elems[0xb] = 0;
  pcVar3 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).maxabs.m_backend;
  (pcVar3->data)._M_elems[0xc] = 0;
  (pcVar3->data)._M_elems[0xd] = 0;
  pcVar3 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).maxabs.m_backend;
  (pcVar3->data)._M_elems[0xe] = 0;
  (pcVar3->data)._M_elems[0xf] = 0;
  *(undefined8 *)
   ((long)(this->
          super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).maxabs.m_backend.data._M_elems + 0x3d) = 0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).rowMemMult.m_backend.fpclass = cpp_dec_float_finite;
  pcVar3 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).rowMemMult.m_backend;
  (pcVar3->data)._M_elems[0xc] = 0;
  (pcVar3->data)._M_elems[0xd] = 0;
  pcVar3 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).rowMemMult.m_backend;
  (pcVar3->data)._M_elems[0xe] = 0;
  (pcVar3->data)._M_elems[0xf] = 0;
  pcVar3 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).rowMemMult.m_backend;
  (pcVar3->data)._M_elems[8] = 0;
  (pcVar3->data)._M_elems[9] = 0;
  pcVar3 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).rowMemMult.m_backend;
  (pcVar3->data)._M_elems[10] = 0;
  (pcVar3->data)._M_elems[0xb] = 0;
  pcVar3 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).rowMemMult.m_backend;
  (pcVar3->data)._M_elems[4] = 0;
  (pcVar3->data)._M_elems[5] = 0;
  pcVar3 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).rowMemMult.m_backend;
  (pcVar3->data)._M_elems[6] = 0;
  (pcVar3->data)._M_elems[7] = 0;
  pnVar1 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).rowMemMult;
  (pnVar1->m_backend).data._M_elems[0] = 0;
  (pnVar1->m_backend).data._M_elems[1] = 0;
  pcVar3 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).rowMemMult.m_backend;
  (pcVar3->data)._M_elems[2] = 0;
  (pcVar3->data)._M_elems[3] = 0;
  *(undefined8 *)
   ((long)(this->
          super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).rowMemMult.m_backend.data._M_elems + 0x3d) = 0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).rowMemMult.m_backend.prec_elem = 0x10;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).colMemMult.m_backend.fpclass = cpp_dec_float_finite;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).colMemMult.m_backend.prec_elem = 0x10;
  pnVar1 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).colMemMult;
  (pnVar1->m_backend).data._M_elems[0] = 0;
  (pnVar1->m_backend).data._M_elems[1] = 0;
  pcVar3 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).colMemMult.m_backend;
  (pcVar3->data)._M_elems[2] = 0;
  (pcVar3->data)._M_elems[3] = 0;
  pcVar3 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).colMemMult.m_backend;
  (pcVar3->data)._M_elems[4] = 0;
  (pcVar3->data)._M_elems[5] = 0;
  pcVar3 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).colMemMult.m_backend;
  (pcVar3->data)._M_elems[6] = 0;
  (pcVar3->data)._M_elems[7] = 0;
  pcVar3 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).colMemMult.m_backend;
  (pcVar3->data)._M_elems[8] = 0;
  (pcVar3->data)._M_elems[9] = 0;
  pcVar3 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).colMemMult.m_backend;
  (pcVar3->data)._M_elems[10] = 0;
  (pcVar3->data)._M_elems[0xb] = 0;
  pcVar3 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).colMemMult.m_backend;
  (pcVar3->data)._M_elems[0xc] = 0;
  (pcVar3->data)._M_elems[0xd] = 0;
  pcVar3 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).colMemMult.m_backend;
  (pcVar3->data)._M_elems[0xe] = 0;
  (pcVar3->data)._M_elems[0xf] = 0;
  *(undefined8 *)
   ((long)(this->
          super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).colMemMult.m_backend.data._M_elems + 0x3d) = 0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).lMemMult.m_backend.fpclass = cpp_dec_float_finite;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).lMemMult.m_backend.prec_elem = 0x10;
  pnVar1 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).lMemMult;
  (pnVar1->m_backend).data._M_elems[0] = 0;
  (pnVar1->m_backend).data._M_elems[1] = 0;
  pcVar3 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).lMemMult.m_backend;
  (pcVar3->data)._M_elems[2] = 0;
  (pcVar3->data)._M_elems[3] = 0;
  pcVar3 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).lMemMult.m_backend;
  (pcVar3->data)._M_elems[4] = 0;
  (pcVar3->data)._M_elems[5] = 0;
  pcVar3 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).lMemMult.m_backend;
  (pcVar3->data)._M_elems[6] = 0;
  (pcVar3->data)._M_elems[7] = 0;
  pcVar3 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).lMemMult.m_backend;
  (pcVar3->data)._M_elems[8] = 0;
  (pcVar3->data)._M_elems[9] = 0;
  pcVar3 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).lMemMult.m_backend;
  (pcVar3->data)._M_elems[10] = 0;
  (pcVar3->data)._M_elems[0xb] = 0;
  pcVar3 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).lMemMult.m_backend;
  (pcVar3->data)._M_elems[0xc] = 0;
  (pcVar3->data)._M_elems[0xd] = 0;
  pcVar3 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).lMemMult.m_backend;
  (pcVar3->data)._M_elems[0xe] = 0;
  (pcVar3->data)._M_elems[0xf] = 0;
  *(undefined8 *)
   ((long)(this->
          super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).lMemMult.m_backend.data._M_elems + 0x3d) = 0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).l.val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).l.val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).l.val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).l.rval.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).l.rval.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).l.rval.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).diag.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).diag.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).diag.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(pointer *)
   ((long)&(this->
           super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).u.row.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.row.val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->
           super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).u.row.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->
           super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).u.col.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.col.val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->
           super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).u.col.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).temp.pivots.next = (Pring *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).temp.pivots.prev = (Pring *)0x0;
  *(undefined8 *)
   ((long)&(this->
           super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).temp.s_max.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->
           super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).temp.s_cact + 4) = 0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).temp.s_max.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).temp.s_max.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).temp.s_mark = (int *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).temp.s_max.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).temp.pivots.mkwtz = -1;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).temp.pivots.idx = -1;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).temp.pivots.pos = -1;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).temp.pivot_row = (Pring *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).temp.pivot_rowNZ = (Pring *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).temp.pivot_col = (Pring *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).temp.pivot_colNZ = (Pring *)0x0;
  (this->
  super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  )._vptr_SLinSolver = (_func_int **)&PTR_getName_006b0ba8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&this->vec,1);
  local_48.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_48.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SSVectorBase(&this->ssvec,1,&local_48);
  if (local_48.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  this->usetup = false;
  this->uptype = FOREST_TOMLIN;
  local_58.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_58.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SSVectorBase(&this->eta,1,&local_58);
  if (local_58.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_68.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_68.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SSVectorBase(&this->forest,1,&local_68);
  if (local_68.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->lastThreshold).m_backend.fpclass = cpp_dec_float_finite;
  (this->lastThreshold).m_backend.prec_elem = 0x10;
  (this->lastThreshold).m_backend.data._M_elems[0] = 0;
  (this->lastThreshold).m_backend.data._M_elems[1] = 0;
  pcVar3 = &(this->lastThreshold).m_backend;
  (pcVar3->data)._M_elems[2] = 0;
  (pcVar3->data)._M_elems[3] = 0;
  pcVar3 = &(this->lastThreshold).m_backend;
  (pcVar3->data)._M_elems[4] = 0;
  (pcVar3->data)._M_elems[5] = 0;
  pcVar3 = &(this->lastThreshold).m_backend;
  (pcVar3->data)._M_elems[6] = 0;
  (pcVar3->data)._M_elems[7] = 0;
  pcVar3 = &(this->lastThreshold).m_backend;
  (pcVar3->data)._M_elems[8] = 0;
  (pcVar3->data)._M_elems[9] = 0;
  pcVar3 = &(this->lastThreshold).m_backend;
  (pcVar3->data)._M_elems[10] = 0;
  (pcVar3->data)._M_elems[0xb] = 0;
  pcVar3 = &(this->lastThreshold).m_backend;
  (pcVar3->data)._M_elems[0xc] = 0;
  (pcVar3->data)._M_elems[0xd] = 0;
  pcVar3 = &(this->lastThreshold).m_backend;
  (pcVar3->data)._M_elems[0xe] = 0;
  (pcVar3->data)._M_elems[0xf] = 0;
  *(undefined8 *)((long)(this->lastThreshold).m_backend.data._M_elems + 0x3d) = 0;
  (this->minThreshold).m_backend.fpclass = cpp_dec_float_finite;
  (this->minThreshold).m_backend.prec_elem = 0x10;
  (this->minThreshold).m_backend.data._M_elems[0] = 0;
  (this->minThreshold).m_backend.data._M_elems[1] = 0;
  pcVar3 = &(this->minThreshold).m_backend;
  (pcVar3->data)._M_elems[2] = 0;
  (pcVar3->data)._M_elems[3] = 0;
  pcVar3 = &(this->minThreshold).m_backend;
  (pcVar3->data)._M_elems[4] = 0;
  (pcVar3->data)._M_elems[5] = 0;
  pcVar3 = &(this->minThreshold).m_backend;
  (pcVar3->data)._M_elems[6] = 0;
  (pcVar3->data)._M_elems[7] = 0;
  pcVar3 = &(this->minThreshold).m_backend;
  (pcVar3->data)._M_elems[8] = 0;
  (pcVar3->data)._M_elems[9] = 0;
  pcVar3 = &(this->minThreshold).m_backend;
  (pcVar3->data)._M_elems[10] = 0;
  (pcVar3->data)._M_elems[0xb] = 0;
  pcVar3 = &(this->minThreshold).m_backend;
  (pcVar3->data)._M_elems[0xc] = 0;
  (pcVar3->data)._M_elems[0xd] = 0;
  pcVar3 = &(this->minThreshold).m_backend;
  (pcVar3->data)._M_elems[0xe] = 0;
  (pcVar3->data)._M_elems[0xf] = 0;
  *(undefined8 *)((long)(this->minThreshold).m_backend.data._M_elems + 0x3d) = 0;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&this->minThreshold,0.01);
  (this->minStability).m_backend.fpclass = cpp_dec_float_finite;
  (this->minStability).m_backend.prec_elem = 0x10;
  (this->minStability).m_backend.data._M_elems[0] = 0;
  (this->minStability).m_backend.data._M_elems[1] = 0;
  pcVar3 = &(this->minStability).m_backend;
  (pcVar3->data)._M_elems[2] = 0;
  (pcVar3->data)._M_elems[3] = 0;
  pcVar3 = &(this->minStability).m_backend;
  (pcVar3->data)._M_elems[4] = 0;
  (pcVar3->data)._M_elems[5] = 0;
  pcVar3 = &(this->minStability).m_backend;
  (pcVar3->data)._M_elems[6] = 0;
  (pcVar3->data)._M_elems[7] = 0;
  pcVar3 = &(this->minStability).m_backend;
  (pcVar3->data)._M_elems[8] = 0;
  (pcVar3->data)._M_elems[9] = 0;
  pcVar3 = &(this->minStability).m_backend;
  (pcVar3->data)._M_elems[10] = 0;
  (pcVar3->data)._M_elems[0xb] = 0;
  pcVar3 = &(this->minStability).m_backend;
  (pcVar3->data)._M_elems[0xc] = 0;
  (pcVar3->data)._M_elems[0xd] = 0;
  pcVar3 = &(this->minStability).m_backend;
  (pcVar3->data)._M_elems[0xe] = 0;
  (pcVar3->data)._M_elems[0xf] = 0;
  *(undefined8 *)((long)(this->minStability).m_backend.data._M_elems + 0x3d) = 0;
  this->timerType = USER_TIME;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.row.elem = (Dring *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.col.elem = (Dring *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.col.idx = (int *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).l.idx = (int *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).thedim = 0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).nzCnt = 0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).row.orig = (int *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).row.perm = (int *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).col.orig = (int *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).col.perm = (int *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).l.start = (int *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).l.row = (int *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).l.ridx = (int *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).l.rbeg = (int *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).l.rorig = (int *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).l.rperm = (int *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.row.idx = (int *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.row.start = (int *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.row.len = (int *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.row.max = (int *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.col.max = (int *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.col.start = (int *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.col.len = (int *)0x0;
  pTVar4 = TimerFactory::createTimer(USER_TIME);
  this->solveTime = pTVar4;
  pTVar4 = TimerFactory::createTimer(this->timerType);
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).factorTime = pTVar4;
  spx_alloc<int*>(&(this->
                   super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).row.perm,
                  (this->
                  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedim);
  spx_alloc<int*>(&(this->
                   super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).row.orig,
                  (this->
                  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedim);
  spx_alloc<int*>(&(this->
                   super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).col.perm,
                  (this->
                  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedim);
  spx_alloc<int*>(&(this->
                   super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).col.orig,
                  (this->
                  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedim);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::resize(&(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).diag,(long)(this->
                         super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).thedim);
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).work = (this->vec).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.row.size = 1;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.row.used = 0;
  spx_alloc<soplex::CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::Dring*>
            (&(this->
              super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).u.row.elem,
             (this->
             super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thedim);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::resize(&(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).u.row.val,
           (long)(this->
                 super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).u.row.size);
  spx_alloc<int*>(&(this->
                   super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).u.row.idx,
                  (this->
                  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).u.row.size);
  spx_alloc<int*>(&(this->
                   super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).u.row.start,
                  (this->
                  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedim + 1);
  spx_alloc<int*>(&(this->
                   super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).u.row.len,
                  (this->
                  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedim + 1);
  spx_alloc<int*>(&(this->
                   super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).u.row.max,
                  (this->
                  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedim + 1);
  iVar2 = (this->
          super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thedim;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.row.list.idx = iVar2;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.row.start[iVar2] = 0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.row.max
  [(this->
   super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   ).thedim] = 0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.row.len
  [(this->
   super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   ).thedim] = 0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.col.size = 1;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.col.used = 0;
  spx_alloc<soplex::CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::Dring*>
            (&(this->
              super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).u.col.elem,
             (this->
             super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thedim);
  spx_alloc<int*>(&(this->
                   super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).u.col.idx,
                  (this->
                  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).u.col.size);
  spx_alloc<int*>(&(this->
                   super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).u.col.start,
                  (this->
                  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedim + 1);
  spx_alloc<int*>(&(this->
                   super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).u.col.len,
                  (this->
                  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedim + 1);
  spx_alloc<int*>(&(this->
                   super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).u.col.max,
                  (this->
                  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedim + 1);
  iVar2 = (this->
          super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thedim;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.col.list.idx = iVar2;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.col.start[iVar2] = 0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.col.max
  [(this->
   super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   ).thedim] = 0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.col.len
  [(this->
   super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   ).thedim] = 0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).l.size = 1;
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::resize(&(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).l.val,1);
  spx_alloc<int*>(&(this->
                   super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).l.idx,(this->
                           super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).l.size);
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).l.startSize = 1;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).l.firstUpdate = 0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).l.firstUnused = 0;
  spx_alloc<int*>(&(this->
                   super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).l.start,1);
  spx_alloc<int*>(&(this->
                   super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).l.row,(this->
                           super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).l.startSize);
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).l.rorig = (int *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).l.rperm = (int *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).l.ridx = (int *)0x0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).l.rbeg = (int *)0x0;
  clear(this);
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).factorCount = 0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).hugeValues = 0;
  this->solveCount = 0;
  return;
}

Assistant:

SLUFactor<R>::SLUFactor()
   : vec(1)
   , ssvec(1)
   , usetup(false)
   , uptype(FOREST_TOMLIN)
   , eta(1)
   , forest(1)
   , minThreshold(0.01)
   , timerType(Timer::USER_TIME)
{
   this->row.perm    = nullptr;
   this->row.orig    = nullptr;
   this->col.perm    = nullptr;
   this->col.orig    = nullptr;
   this->u.row.elem  = nullptr;
   this->u.row.idx   = nullptr;
   this->u.row.start = nullptr;
   this->u.row.len   = nullptr;
   this->u.row.max   = nullptr;
   this->u.col.elem  = nullptr;
   this->u.col.idx   = nullptr;
   this->u.col.start = nullptr;
   this->u.col.len   = nullptr;
   this->u.col.max   = nullptr;
   this->l.idx       = nullptr;
   this->l.start     = nullptr;
   this->l.row       = nullptr;
   this->l.ridx      = nullptr;
   this->l.rbeg      = nullptr;
   this->l.rorig     = nullptr;
   this->l.rperm     = nullptr;

   this->nzCnt  = 0;
   this->thedim = 0;

   try
   {
      solveTime = TimerFactory::createTimer(timerType);
      this->factorTime = TimerFactory::createTimer(timerType);
      spx_alloc(this->row.perm, this->thedim);
      spx_alloc(this->row.orig, this->thedim);
      spx_alloc(this->col.perm, this->thedim);
      spx_alloc(this->col.orig, this->thedim);

      this->diag.resize(this->thedim);

      this->work = vec.get_ptr();

      this->u.row.size = 1;
      this->u.row.used = 0;
      spx_alloc(this->u.row.elem,  this->thedim);
      this->u.row.val.resize(this->u.row.size);
      spx_alloc(this->u.row.idx,   this->u.row.size);
      spx_alloc(this->u.row.start, this->thedim + 1);
      spx_alloc(this->u.row.len,   this->thedim + 1);
      spx_alloc(this->u.row.max,   this->thedim + 1);

      this->u.row.list.idx      = this->thedim;
      this->u.row.start[this->thedim] = 0;
      this->u.row.max  [this->thedim] = 0;
      this->u.row.len  [this->thedim] = 0;

      this->u.col.size = 1;
      this->u.col.used = 0;
      spx_alloc(this->u.col.elem,  this->thedim);
      spx_alloc(this->u.col.idx,   this->u.col.size);
      spx_alloc(this->u.col.start, this->thedim + 1);
      spx_alloc(this->u.col.len,   this->thedim + 1);
      spx_alloc(this->u.col.max,   this->thedim + 1);

      this->u.col.list.idx      = this->thedim;
      this->u.col.start[this->thedim] = 0;
      this->u.col.max[this->thedim]   = 0;
      this->u.col.len[this->thedim]   = 0;

      this->l.size = 1;

      this->l.val.resize(this->l.size);
      spx_alloc(this->l.idx, this->l.size);

      this->l.startSize   = 1;
      this->l.firstUpdate = 0;
      this->l.firstUnused = 0;

      spx_alloc(this->l.start, this->l.startSize);
      spx_alloc(this->l.row,   this->l.startSize);
   }
   catch(const SPxMemoryException& x)
   {
      freeAll();
      throw x;
   }

   this->l.ridx  = nullptr;
   this->l.rbeg  = nullptr;
   this->l.rorig = nullptr;
   this->l.rperm = nullptr;

   SLUFactor<R>::clear(); // clear() is virtual

   this->factorCount = 0;
   this->hugeValues = 0;
   solveCount  = 0;
   assert(this->row.perm != nullptr);

   assert(this->row.orig != nullptr);
   assert(this->col.perm != nullptr);
   assert(this->col.orig != nullptr);

   assert(this->u.row.elem  != nullptr);
   assert(this->u.row.idx   != nullptr);
   assert(this->u.row.start != nullptr);
   assert(this->u.row.len   != nullptr);
   assert(this->u.row.max   != nullptr);

   assert(this->u.col.elem  != nullptr);
   assert(this->u.col.idx   != nullptr);
   assert(this->u.col.start != nullptr);
   assert(this->u.col.len   != nullptr);
   assert(this->u.col.max   != nullptr);

   assert(this->l.idx   != nullptr);
   assert(this->l.start != nullptr);
   assert(this->l.row   != nullptr);

   assert(SLUFactor<R>::isConsistent());
}